

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * uprv_decNumberLogB_63(decNumber *res,decNumber *rhs,decContext *set)

{
  int iVar1;
  int iVar2;
  uint in_EAX;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if ((rhs->bits & 0x30) == 0) {
    if ((rhs->bits & 0x40) != 0) {
      uprv_decNumberCopy_63(res,rhs);
      res->bits = res->bits & 0x7f;
      return res;
    }
    iVar1 = rhs->digits;
    if (iVar1 != 1 || rhs->lsu[0] != '\0') {
      iVar2 = rhs->exponent;
      uVar3 = (iVar1 + iVar2) - 1;
      uVar4 = -uVar3;
      if (0 < (int)uVar3) {
        uVar4 = uVar3;
      }
      uprv_decNumberFromUInt32_63(res,uVar4);
      if (0 < iVar1 + iVar2) {
        return res;
      }
      res->bits = 0x80;
      return res;
    }
    res->digits = 1;
    res->exponent = 0;
    res->bits = 0xc0;
    res->lsu[0] = '\0';
    uVar4 = 2;
  }
  else {
    decNaNs(res,rhs,(decNumber *)0x0,set,(uint32_t *)((long)&uStack_28 + 4));
    uVar4 = uStack_28._4_4_;
    if (uStack_28._4_4_ == 0) {
      return res;
    }
  }
  decStatus(res,uVar4,set);
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberLogB(decNumber *res, const decNumber *rhs,
                          decContext *set) {
  uInt status=0;                   /* accumulator  */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* NaNs as usual; Infinities return +Infinity; 0->oops  */
  if (decNumberIsNaN(rhs)) decNaNs(res, rhs, NULL, set, &status);
   else if (decNumberIsInfinite(rhs)) uprv_decNumberCopyAbs(res, rhs);
   else if (decNumberIsZero(rhs)) {
    uprv_decNumberZero(res);                 /* prepare for Infinity  */
    res->bits=DECNEG|DECINF;            /* -Infinity  */
    status|=DEC_Division_by_zero;       /* as per 754  */
    }
   else { /* finite non-zero  */
    Int ae=rhs->exponent+rhs->digits-1; /* adjusted exponent  */
    uprv_decNumberFromInt32(res, ae);        /* lay it out  */
    }

  if (status!=0) decStatus(res, status, set);
  return res;
  }